

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetMouseDragDelta(int button,float lock_threshold)

{
  int in_EDI;
  float in_XMM0_Da;
  ImGuiContext *g;
  float local_10;
  ImVec2 local_8;
  
  local_10 = in_XMM0_Da;
  if (in_XMM0_Da < 0.0) {
    local_10 = (GImGui->IO).MouseDragThreshold;
  }
  if ((((GImGui->IO).MouseDown[in_EDI] & 1U) == 0) ||
     ((GImGui->IO).MouseDragMaxDistanceSqr[in_EDI] < local_10 * local_10)) {
    ImVec2::ImVec2(&local_8,0.0,0.0);
  }
  else {
    local_8 = operator-((ImVec2 *)GImGui,(ImVec2 *)0x12bfa8);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(int button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            return g.IO.MousePos - g.IO.MouseClickedPos[button];     // Assume we can only get active with left-mouse button (at the moment).
    return ImVec2(0.0f, 0.0f);
}